

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Deserializer.hpp
# Opt level: O2

void mserialize::detail::
     BuiltinDeserializer<std::unordered_map<int,_char,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_char>_>_>,_void>
     ::deserialize_elems<InputStream>
               (_Hashtable<int,std::pair<int_const,char>,std::allocator<std::pair<int_const,char>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *param_1,int param_2,undefined8 param_3)

{
  ulong in_RAX;
  undefined8 uVar1;
  bool bVar2;
  pair<std::__detail::_Node_iterator<std::pair<const_int,_char>,_false,_false>,_bool> pVar3;
  T elem;
  ulong local_28;
  
  uVar1 = param_3;
  local_28 = in_RAX;
  while (bVar2 = param_2 != 0, param_2 = param_2 + -1, bVar2) {
    local_28 = local_28 & 0xffffff0000000000;
    BuiltinDeserializer<std::pair<int,char>,void>::deserialize_elems<InputStream,0ul,1ul>
              (&local_28,param_3,uVar1);
    pVar3 = std::
            _Hashtable<int,std::pair<int_const,char>,std::allocator<std::pair<int_const,char>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
            ::_M_emplace<std::pair<int,char>>(param_1,&local_28);
    uVar1 = pVar3._8_8_;
  }
  return;
}

Assistant:

static void deserialize_elems(
    std::true_type  /* has insert */,
    Sequence& s, std::uint32_t size, InputStream& istream
  )
  {
    // map value_type is pair<const K, V>, we need pair<K, V>
    using T = deep_remove_const_t<typename Sequence::value_type>;

    while (size--)
    {
      T elem;
      mserialize::deserialize(elem, istream);
      s.insert(std::move(elem));
    }
  }